

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void duckdb::QuantileOperation::
     ConstantOperation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<float,false>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,float *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  iterator __position;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  if (count != 0) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44(*input,(undefined4)uStack_28);
      __position._M_current =
           (state->v).super_vector<float,_std::allocator<float>_>.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (state->v).super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)state,__position,
                   (float *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = *input;
        (state->v).super_vector<float,_std::allocator<float>_>.
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
             = __position._M_current + 1;
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}